

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPHandler.h
# Opt level: O3

void __thiscall HTTPHandler<Client>::handle(HTTPHandler<Client> *this,Client *client)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  size_t sVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  pointer *__ptr;
  Request request;
  Response resp;
  istream *local_1a8;
  path local_1a0;
  Request local_178;
  Response local_f8;
  
  paVar1 = &local_f8.protocol.field_2;
  local_f8.protocol._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"\r\n\r\n","");
  Client::read_until<std::__cxx11::stringstream>((Client *)&local_1a8,(string *)client);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.protocol._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.protocol._M_dataplus._M_p,
                    local_f8.protocol.field_2._M_allocated_capacity + 1);
  }
  if (local_1a8 != (istream *)0x0) {
    Request::Request(&local_178,local_1a8);
    poVar2 = this->stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"---------- Request ----------",0x1d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    poVar2 = (ostream *)std::ostream::flush();
    poVar2 = operator<<(poVar2,&local_178);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"-----------------------------",0x1d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::filesystem::__cxx11::path::path(&local_1a0,&this->resolve_path);
    Response::Response(&local_f8,&local_178,&local_1a0);
    std::filesystem::__cxx11::path::~path(&local_1a0);
    sVar3 = Response::get_content_length(&local_f8);
    if (sVar3 < 200) {
      poVar2 = this->stream;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"---------- Response ----------",0x1e);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      pbVar4 = (basic_ostream<char,_std::char_traits<char>_> *)std::ostream::flush();
      pbVar4 = operator<<(pbVar4,&local_f8);
      std::ios::widen((char)*(undefined8 *)(*(long *)pbVar4 + -0x18) + (char)pbVar4);
      std::ostream::put((char)pbVar4);
      poVar2 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"------------------------------",0x1e);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    operator<<(client,&local_f8);
    Response::~Response(&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.host._M_dataplus._M_p != &local_178.host.field_2) {
      operator_delete(local_178.host._M_dataplus._M_p,
                      local_178.host.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.protocol._M_dataplus._M_p != &local_178.protocol.field_2) {
      operator_delete(local_178.protocol._M_dataplus._M_p,
                      local_178.protocol.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.path._M_dataplus._M_p != &local_178.path.field_2) {
      operator_delete(local_178.path._M_dataplus._M_p,
                      local_178.path.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.method._M_dataplus._M_p != &local_178.method.field_2) {
      operator_delete(local_178.method._M_dataplus._M_p,
                      local_178.method.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != (istream *)0x0) {
      (**(code **)(*(long *)local_1a8 + 8))();
    }
  }
  return;
}

Assistant:

void HTTPHandler<T>::handle(T&& client) {
    auto result = client.read_until("\r\n\r\n");

    if (!result) {
        return;
    }

    Request request(*result);
    stream << "---------- Request ----------" << std::endl
           << request                         << std::endl
           << "-----------------------------" << std::endl;

    Response resp(request, resolve_path);
    if (resp.get_content_length() < 200) {
        stream << "---------- Response ----------" << std::endl
               << resp                             << std::endl
               << "------------------------------" << std::endl;
    }

    client << resp;
}